

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O2

vector<int_*,_std::allocator<int_*>_> * __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::queryRectangle(vector<int_*,_std::allocator<int_*>_> *__return_storage_ptr__,
                KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                *this,int *searchMin,int *searchMax)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (lVar3 == 5) {
      if (this->root != (Node *)0x0) {
        queryRectangle(__return_storage_ptr__,this,this->root,searchMin,searchMax,
                       this->boundingBoxMin,this->boundingBoxMax,0);
        return __return_storage_ptr__;
      }
      break;
    }
    piVar1 = searchMax + lVar3;
    piVar2 = searchMin + lVar3;
    lVar3 = lVar3 + 1;
  } while (*piVar2 <= *piVar1);
  (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int_*,_std::allocator<int_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<T*> queryRectangle(T* searchMin, T* searchMax) {
			for (int d = 0; d < dim; d++) {
				if (LESS()(searchMax, searchMin, d)) {
					return std::vector<T*>();
				}
			}

			if (root == nullptr) {
				return std::vector<T*>();
			}

			const int zeroDepth = 0;
			return queryRectangle(root, searchMin, searchMax, boundingBoxMin, boundingBoxMax, zeroDepth);
		}